

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,double kappa,double delta,double theta,double obj_amp)

{
  undefined1 auVar1 [16];
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  long lVar2;
  int *piVar3;
  bool bVar4;
  row_value rVar5;
  undefined8 extraout_RAX;
  row_iterator prVar6;
  long lVar7;
  rc_data *__first;
  undefined8 uVar8;
  rc_data *__last;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  rc_size sizes;
  int selected;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_94;
  rc_size local_90;
  int local_84;
  undefined1 local_80 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_70;
  row_value *local_68;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_60;
  undefined8 local_58;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined1 extraout_var [56];
  
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  local_50._M_head_impl = (col_value *)obj_amp;
  local_48 = theta;
  local_40 = delta;
  local_38 = kappa;
  debug_logger<true>::log<double,double,double>
            ((debug_logger<true> *)this,fmt,&local_38,&local_40,&local_48);
  rVar5 = (row_value)(first->current)._M_current;
  if (rVar5 == (row_value)(last->current)._M_current) {
    uVar8._0_4_ = 0;
    uVar8._4_4_ = 0;
  }
  else {
    local_70._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 0x10);
    uVar8._0_4_ = 0;
    uVar8._4_4_ = 0;
    local_68 = (row_value *)first;
    local_60._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
            )last;
    do {
      local_94 = *(int *)((long)rVar5 + -4);
      if (*(int *)(this + 0x88) <= local_94) {
        push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      local_58 = uVar8;
      sparse_matrix<int>::row
                ((sparse_matrix<int> *)local_80,
                 (int)local_70._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl);
      if (local_80._8_8_ != local_80._0_8_) {
        lVar7 = *(long *)(this + 0x50);
        prVar6 = (row_iterator)local_80._8_8_;
        do {
          piVar3 = &prVar6->value;
          prVar6 = prVar6 + 1;
          *(double *)(lVar7 + (long)*piVar3 * 8) = local_48 * *(double *)(lVar7 + (long)*piVar3 * 8)
          ;
        } while (prVar6 != (row_iterator)local_80._0_8_);
      }
      local_90 = solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                 ::compute_reduced_costs<baryonyx::bit_array>
                           ((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                             *)this,(row_iterator)local_80._8_8_,(row_iterator)local_80._0_8_,x);
      if (local_90.r_size != 0) {
        __first = *(rc_data **)(this + 0x68);
        lVar7 = 0;
        uVar9 = 0;
        do {
          auVar11._0_8_ =
               quadratic_cost_type<double>::operator()
                         (*(quadratic_cost_type<double> **)(this + 0x80),
                          ((row_iterator)
                          (local_80._8_8_ + (long)*(int *)((long)&__first->id + lVar7) * 8))->column
                          ,x);
          auVar11._8_56_ = extraout_var;
          __first = *(rc_data **)(this + 0x68);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_50._M_head_impl;
          uVar9 = uVar9 + 1;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)((long)&__first->value + lVar7);
          auVar1 = vfmadd213sd_fma(auVar11._0_16_,auVar12,auVar1);
          *(long *)((long)&__first->value + lVar7) = auVar1._0_8_;
          lVar7 = lVar7 + 0x10;
        } while (uVar9 != ((ulong)local_90 & 0xffffffff));
        if (1 < local_90.r_size) {
          lVar7 = (long)local_90.r_size;
          __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                 (this + 8);
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,__first + lVar7,(int)LZCOUNT(lVar7) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,__first + lVar7);
          __last = __first + 1;
          lVar7 = lVar7 * 0x10 + -0x10;
          do {
            if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (__first,__last,__g);
              __first = __last;
            }
            __last = __last + 1;
            lVar7 = lVar7 + -0x10;
          } while (lVar7 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (__first,__last,__g);
        }
      }
      local_84 = solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                 ::select_variables((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                                     *)this,&local_90,
                                    *(int *)(*(long *)(this + 0x70) + (long)local_94 * 0xc),
                                    *(int *)(*(long *)(this + 0x70) + 4 + (long)local_94 * 0xc));
      fmt_00._M_str = "constraints {}: {} <= ";
      fmt_00._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_00,&local_94,
                 (int *)((long)local_94 * 0xc + *(long *)(this + 0x70)));
      if (0 < local_90.r_size) {
        lVar7 = 0xc;
        lVar10 = 0;
        do {
          lVar2 = *(long *)(this + 0x68);
          fmt_01._M_str = "{} ({} {}) ";
          fmt_01._M_len = 0xb;
          debug_logger<true>::log<int,double,int>
                    ((debug_logger<true> *)this,fmt_01,(int *)(lVar2 + -4 + lVar7),
                     (double *)(lVar2 + -0xc + lVar7),(int *)(lVar2 + lVar7));
          lVar10 = lVar10 + 1;
          lVar7 = lVar7 + 0x10;
        } while (lVar10 < local_90.r_size);
      }
      fmt_02._M_str = "<= {} => Selected: {}\n";
      fmt_02._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_02,
                 (int *)(*(long *)(this + 0x70) + 4 + (long)local_94 * 0xc),&local_84);
      bVar4 = affect<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
                        ((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                          *)this,x,(row_value *)local_80._8_8_,local_94,local_84,local_90.r_size,
                         local_38,local_40);
      uVar8._1_7_ = SUB87(local_58,1);
      uVar8._0_1_ = (byte)local_58 | bVar4;
      rVar5 = (row_value)((long)*local_68 + -4);
      *local_68 = rVar5;
    } while (rVar5 != *(row_value *)
                       local_60._M_t.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl);
  }
  return (bool)((byte)uVar8 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({} {}) ", R[i].f, R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }